

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileOperation::
     Operation<float,duckdb::ReservoirQuantileState<float>,duckdb::ReservoirQuantileScalarOperation>
               (ReservoirQuantileState<float> *state,float *input,AggregateUnaryInput *unary_input)

{
  FunctionData *pFVar1;
  BaseReservoirSampling *this;
  
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&unary_input->input->bind_data);
  if (state->pos == 0) {
    ReservoirQuantileState<float>::Resize(state,(idx_t)pFVar1[4]._vptr_FunctionData);
  }
  if (state->r_samp == (BaseReservoirSampling *)0x0) {
    this = (BaseReservoirSampling *)operator_new(0x78);
    BaseReservoirSampling::BaseReservoirSampling(this);
    state->r_samp = this;
  }
  ReservoirQuantileState<float>::FillReservoir(state,(idx_t)pFVar1[4]._vptr_FunctionData,*input);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_data = unary_input.input.bind_data->template Cast<ReservoirQuantileBindData>();
		if (state.pos == 0) {
			state.Resize(bind_data.sample_size);
		}
		if (!state.r_samp) {
			state.r_samp = new BaseReservoirSampling();
		}
		D_ASSERT(state.v);
		state.FillReservoir(bind_data.sample_size, input);
	}